

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  PropertyDeclarationSyntax *pPVar1;
  BumpAllocator *unaff_RBX;
  Token TVar2;
  Token TVar3;
  SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *in_stack_00000020;
  PropertySpecSyntax *in_stack_00000028;
  Token *in_stack_00000030;
  Token *in_stack_00000038;
  NamedBlockClauseSyntax **in_stack_00000040;
  BumpAllocator *in_stack_00000078;
  Token *in_stack_00000080;
  BumpAllocator *in_stack_ffffffffffffff28;
  AssertionItemPortListSyntax *in_stack_ffffffffffffff30;
  Token *args_4;
  BumpAllocator *in_stack_ffffffffffffffd0;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__child_stack,
             in_stack_ffffffffffffffd0);
  TVar2 = parsing::Token::deepClone(in_stack_00000080,in_stack_00000078);
  TVar3 = parsing::Token::deepClone(in_stack_00000080,in_stack_00000078);
  args_4 = (Token *)TVar3.info;
  if ((((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)((long)__fn + 0x70))->
      super_SyntaxListBase)._vptr_SyntaxListBase != (_func_int **)0x0) {
    deepClone<slang::syntax::AssertionItemPortListSyntax>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  parsing::Token::deepClone(in_stack_00000080,in_stack_00000078);
  deepClone<slang::syntax::LocalVariableDeclarationSyntax>
            ((SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *)__child_stack,
             (BumpAllocator *)TVar2.info);
  not_null<slang::syntax::PropertySpecSyntax_*>::operator*
            ((not_null<slang::syntax::PropertySpecSyntax_*> *)0xa5d1ba);
  deepClone<slang::syntax::PropertySpecSyntax>
            ((PropertySpecSyntax *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  parsing::Token::deepClone(in_stack_00000080,in_stack_00000078);
  parsing::Token::deepClone(in_stack_00000080,in_stack_00000078);
  if (*(long *)&(((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)((long)__fn + 0xe0))->
                super_SyntaxListBase).super_SyntaxNode != 0) {
    deepClone<slang::syntax::NamedBlockClauseSyntax>
              ((NamedBlockClauseSyntax *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::PropertyDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::AssertionItemPortListSyntax*,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::LocalVariableDeclarationSyntax>&,slang::syntax::PropertySpecSyntax&,slang::parsing::Token,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
                     (unaff_RBX,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__fn,
                      (Token *)__child_stack,(Token *)TVar2.info,TVar2._0_8_,args_4,
                      in_stack_00000020,in_stack_00000028,in_stack_00000030,in_stack_00000038,
                      in_stack_00000040);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const PropertyDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<PropertyDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.name.deepClone(alloc),
        node.portList ? deepClone(*node.portList, alloc) : nullptr,
        node.semi.deepClone(alloc),
        *deepClone(node.variables, alloc),
        *deepClone<PropertySpecSyntax>(*node.propertySpec, alloc),
        node.optionalSemi.deepClone(alloc),
        node.end.deepClone(alloc),
        node.endBlockName ? deepClone(*node.endBlockName, alloc) : nullptr
    );
}